

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

string * fs_drop_slash_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  bool bVar1;
  _Bool _Var2;
  __type _Var3;
  char *pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  char *pcVar7;
  char cVar8;
  size_type sVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  string_view in_stack_ffffffffffffffb8;
  
  fs_as_posix_abi_cxx11_(in_stack_ffffffffffffffb8);
  while ((1 < __return_storage_ptr__->_M_string_length &&
         ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          == '/'))) {
    std::__cxx11::string::pop_back();
  }
  _Var2 = fs_is_windows();
  if (_Var2 && in._M_len != 0) {
    fs_root_name_abi_cxx11_((string *)&stack0xffffffffffffffc0,in);
    _Var3 = std::operator==(__return_storage_ptr__,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    if (_Var3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar9 = __return_storage_ptr__->_M_string_length;
  pcVar7 = pcVar5 + sVar9;
  if (sVar9 == 0) {
    sVar9 = 0;
  }
  else {
    lVar11 = 0;
    while (lVar10 = lVar11, sVar9 - 1 != lVar10) {
      lVar11 = lVar10 + 1;
      if ((pcVar5[lVar10] == '/') && (pcVar5[lVar10 + 1] == '/')) {
        pcVar6 = pcVar5 + lVar10;
        pcVar4 = pcVar5 + lVar11;
        cVar8 = '/';
        do {
          bVar12 = cVar8 == '/';
          do {
            pcVar4 = pcVar4 + 1;
            if (pcVar4 == pcVar7) {
              pcVar7 = pcVar6 + 1;
              pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
              sVar9 = __return_storage_ptr__->_M_string_length;
              goto LAB_0011d94d;
            }
            cVar8 = *pcVar4;
            bVar1 = (bool)(bVar12 & cVar8 == '/');
            bVar12 = true;
          } while (bVar1);
          pcVar6[1] = cVar8;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
    }
  }
LAB_0011d94d:
  std::__cxx11::string::erase(__return_storage_ptr__,pcVar7,pcVar5 + sVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_drop_slash(std::string_view in)
{
  // drop all trailing "/" and duplicated internal "/"
  std::string s = fs_as_posix(in);

  while(s.length() > 1 && s.back() == '/')
    s.pop_back();

  if (fs_is_windows() && !in.empty() && s == fs_root_name(in))
    s.append("/");

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed trailing slash: " << s << "\n";

  s.erase(std::unique(s.begin(), s.end(), [](char a, char b){ return a == '/' && b == '/'; }), s.end());

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed duplicated internal slashes: " << s << "\n";

  return s;
}